

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateBlockingStub
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  mapped_type *pmVar2;
  AlphaNum *a;
  size_t sVar3;
  long lVar4;
  int i;
  long lVar5;
  MethodDescriptor *method;
  AlphaNum local_f8;
  key_type local_c8;
  string local_a8;
  undefined1 local_88 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  allocator local_31;
  
  io::Printer::Print<>
            (printer,
             "public static BlockingInterface newBlockingStub(\n    com.google.protobuf.BlockingRpcChannel channel) {\n  return new BlockingStub(channel);\n}\n\n"
            );
  io::Printer::Print<>(printer,"public interface BlockingInterface {");
  google::protobuf::io::Printer::Indent();
  lVar4 = 0;
  for (lVar5 = 0; pSVar1 = (this->super_ServiceGenerator).descriptor_,
      lVar5 < *(int *)(pSVar1 + 0x28); lVar5 = lVar5 + 1) {
    GenerateBlockingMethodSignature
              (this,printer,(MethodDescriptor *)(*(long *)(pSVar1 + 0x20) + lVar4));
    io::Printer::Print<>(printer,";\n");
    lVar4 = lVar4 + 0x68;
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>
            (printer,"private static final class BlockingStub implements BlockingInterface {\n");
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<>
            (printer,
             "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n  this.channel = channel;\n}\n\nprivate final com.google.protobuf.BlockingRpcChannel channel;\n"
            );
  sVar3 = 0;
  lVar4 = 0;
  while( true ) {
    pSVar1 = (this->super_ServiceGenerator).descriptor_;
    if (*(int *)(pSVar1 + 0x28) <= lVar4) break;
    method = (MethodDescriptor *)(*(long *)(pSVar1 + 0x20) + sVar3);
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar3;
    GenerateBlockingMethodSignature(this,printer,method);
    io::Printer::Print<>(printer," {\n");
    google::protobuf::io::Printer::Indent();
    vars._M_t._M_impl._0_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    strings::AlphaNum::AlphaNum(&local_f8,(int)lVar4);
    StrCat_abi_cxx11_(&local_a8,(protobuf *)&local_f8,a);
    std::__cxx11::string::string((string *)&local_c8,"index",&local_31);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_88,&local_c8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    GetOutput_abi_cxx11_((string *)&local_f8,this,method);
    std::__cxx11::string::string((string *)&local_a8,"output",(allocator *)&local_c8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_88,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_f8);
    google::protobuf::io::Printer::Print((map *)printer,(char *)local_88);
    google::protobuf::io::Printer::Outdent();
    io::Printer::Print<>(printer,"}\n\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_88);
    lVar4 = lVar4 + 1;
    sVar3 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x68;
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateBlockingStub(io::Printer* printer) {
  printer->Print(
      "public static BlockingInterface newBlockingStub(\n"
      "    com.google.protobuf.BlockingRpcChannel channel) {\n"
      "  return new BlockingStub(channel);\n"
      "}\n"
      "\n");

  printer->Print("public interface BlockingInterface {");
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(";\n");
  }

  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "private static final class BlockingStub implements BlockingInterface "
      "{\n");
  printer->Indent();

  printer->Print(
      "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n"
      "  this.channel = channel;\n"
      "}\n"
      "\n"
      "private final com.google.protobuf.BlockingRpcChannel channel;\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(" {\n");
    printer->Indent();

    std::map<std::string, std::string> vars;
    vars["index"] = StrCat(i);
    vars["output"] = GetOutput(method);
    printer->Print(vars,
                   "return ($output$) channel.callBlockingMethod(\n"
                   "  getDescriptor().getMethods().get($index$),\n"
                   "  controller,\n"
                   "  request,\n"
                   "  $output$.getDefaultInstance());\n");

    printer->Outdent();
    printer->Print(
        "}\n"
        "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}